

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

uint8_t get_per_atmid(CPUS390XState_conflict *env)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  CPUS390XState_conflict *env_local;
  
  bVar1 = 0;
  if (((env->psw).mask & 0x100000000) != 0) {
    bVar1 = 0x80;
  }
  bVar2 = 0;
  if (((env->psw).mask & 0x80000000) != 0) {
    bVar2 = 0x20;
  }
  bVar3 = 0;
  if (((env->psw).mask & 0x400000000000000) != 0) {
    bVar3 = 0x10;
  }
  bVar4 = 0;
  if (((env->psw).mask & 0x800000000000) != 0) {
    bVar4 = 8;
  }
  bVar5 = 0;
  if (((env->psw).mask & 0x400000000000) != 0) {
    bVar5 = 4;
  }
  return bVar1 | 0x40 | bVar2 | bVar3 | bVar4 | bVar5;
}

Assistant:

static inline uint8_t get_per_atmid(CPUS390XState *env)
{
    return ((env->psw.mask & PSW_MASK_64) ?       (1 << 7) : 0) |
                                                  (1 << 6)      |
           ((env->psw.mask & PSW_MASK_32) ?       (1 << 5) : 0) |
           ((env->psw.mask & PSW_MASK_DAT) ?      (1 << 4) : 0) |
           ((env->psw.mask & PSW_ASC_SECONDARY) ? (1 << 3) : 0) |
           ((env->psw.mask & PSW_ASC_ACCREG) ?    (1 << 2) : 0);
}